

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLDateTime::getYearMonth(XMLDateTime *this)

{
  ulong uVar1;
  int iVar2;
  XMLSize_t i;
  ulong uVar3;
  SchemaDateTimeException *this_00;
  long lVar4;
  XMLSize_t start;
  
  uVar1 = this->fEnd;
  if (uVar1 < this->fStart + 7) {
    this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    SchemaDateTimeException::SchemaDateTimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,0x4a8,DateTime_ym_incomplete,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
  }
  else {
    uVar3 = this->fStart + (ulong)(*this->fBuffer == L'-');
    if (uVar3 < uVar1) {
      lVar4 = uVar3 * -0x100000000;
      do {
        if (this->fBuffer[uVar3] == L'-') {
          if ((int)uVar3 != -1) {
            iVar2 = parseIntYear(this,-lVar4 >> 0x20);
            this->fValue[0] = iVar2;
            start = 0x100000000 - lVar4 >> 0x20;
            this->fStart = start;
            if (start + 2 <= this->fEnd) {
              iVar2 = parseInt(this,start,0x300000000 - lVar4 >> 0x20);
              this->fValue[1] = iVar2;
              this->fStart = this->fStart + 2;
              return;
            }
            this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
            SchemaDateTimeException::SchemaDateTimeException
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                       ,0x4c3,DateTime_ym_noMonth,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,
                       (XMLCh *)0x0,this->fMemoryManager);
            goto LAB_0024d1cb;
          }
          break;
        }
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + -0x100000000;
      } while (uVar1 != uVar3);
    }
    this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    SchemaDateTimeException::SchemaDateTimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,0x4b6,DateTime_ym_invalid,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
  }
LAB_0024d1cb:
  __cxa_throw(this_00,&SchemaDateTimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XMLDateTime::getYearMonth()
{

    // Ensure enough chars in buffer
    if ( (fStart+YMONTH_MIN_SIZE) > fEnd)
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_ym_incomplete
                , fBuffer
                , fMemoryManager);
        //"Imcomplete YearMonth Format";

    // skip the first leading '-'
    XMLSize_t start = ( fBuffer[0] == chDash ) ? fStart + 1 : fStart;

    //
    // search for year separator '-'
    //
    int yearSeparator = indexOf(start, fEnd, DATE_SEPARATOR);
    if ( yearSeparator == NOT_FOUND)
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_ym_invalid
                , fBuffer
                , fMemoryManager);
        //("Year separator is missing or misplaced");

    fValue[CentYear] = parseIntYear(yearSeparator);
    fStart = yearSeparator + 1;  //skip the '-' and point to the first M

    //
    //gonna check we have enough byte for month
    //
    if ((fStart + 2) > fEnd )
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_ym_noMonth
                , fBuffer
                , fMemoryManager);
        //"no month in buffer"

    fValue[Month] = parseInt(fStart, yearSeparator + 3);
    fStart += 2;  //fStart points right after the MONTH

    return;
}